

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalnull.c
# Opt level: O3

int fftscl(fitsfile *fptr,int colnum,double scale,double zero,int *status)

{
  tcolumn *ptVar1;
  int iVar2;
  int hdutype;
  int local_2c;
  double local_28;
  double local_20;
  
  if (0 < *status) {
    return *status;
  }
  if ((scale != 0.0) || (NAN(scale))) {
    local_28 = scale;
    local_20 = zero;
    iVar2 = ffghdt(fptr,&local_2c,status);
    if (iVar2 < 1) {
      if (local_2c == 0) {
        *status = 0xeb;
        return 0xeb;
      }
      ptVar1 = fptr->Fptr->tableptr;
      ptVar1[(long)colnum + -1].tscale = local_28;
      ptVar1[(long)colnum + -1].tzero = local_20;
    }
    iVar2 = *status;
  }
  else {
    *status = 0x142;
    iVar2 = 0x142;
  }
  return iVar2;
}

Assistant:

int fftscl(fitsfile *fptr,      /* I - FITS file pointer */
           int colnum,          /* I - column number to apply scaling to */
           double scale,        /* I - scaling factor: value of TSCALn   */
           double zero,         /* I - zero point: value of TZEROn       */
           int *status)         /* IO - error status     */
/*
  Define the linear scaling factor for the TABLE or BINTABLE extension
  column values. This routine overrides the scaling values given by the
  TSCALn and TZEROn keywords if present.  Note that this routine does not
  write or modify the TSCALn and TZEROn keywords, but instead only modifies
  the values temporarily in the internal buffer.  Thus, a subsequent call to
  the ffrdef routine will reset the scaling back to the TSCALn and TZEROn
  keyword values (or 1. and 0. respectively if the keywords are not present).
*/
{
    tcolumn *colptr;
    int hdutype;

    if (*status > 0)
        return(*status);

    if (scale == 0)
        return(*status = ZERO_SCALE);  /* zero scale value is illegal */

    if (ffghdt(fptr, &hdutype, status) > 0)  /* get HDU type */
        return(*status);

    if (hdutype == IMAGE_HDU)
        return(*status = NOT_TABLE);         /* not proper HDU type */

    colptr = (fptr->Fptr)->tableptr;   /* set pointer to the first column */
    colptr += (colnum - 1);     /* increment to the correct column */

    colptr->tscale = scale;
    colptr->tzero = zero;

    return(*status);
}